

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::
     PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
     scan(BinaryenIRValidator *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_BinaryenIRValidator_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_009daf5e:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_009dabfb:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_009daf5e;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ).
                     super_Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_009daaac;
  case LoopId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_009daf5e;
    }
    goto LAB_009da7e2;
  case BreakId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_009daf5e;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ).
                     super_Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_009da467;
  case SwitchId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_009daf5e;
    }
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x009da216;
  case CallId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_009daf5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_009daf5e;
    }
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_009daf5e;
    }
    break;
  case LocalSetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_009daf5e;
    }
    goto LAB_009dabd7;
  case GlobalGetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_009daf5e;
    }
    break;
  case GlobalSetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_009daf5e;
    }
    goto LAB_009da7e2;
  case LoadId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_009daf5e;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_009dabe5;
  case StoreId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_009daf5e;
    }
    goto LAB_009da899;
  case ConstId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_009daf5e;
    }
    break;
  case UnaryId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_009daf5e;
    }
    goto LAB_009dabd7;
  case BinaryId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab27;
  case SelectId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_009daf5e;
    }
    goto LAB_009da521;
  case DropId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case ReturnId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_009daf5e;
    }
    goto LAB_009da20d;
  case MemorySizeId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_009daf5e;
    }
    break;
  case MemoryGrowId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case NopId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_009daf5e;
    }
    break;
  case UnreachableId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_009daf5e;
    }
    break;
  case AtomicRMWId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_009daf5e;
    }
    goto LAB_009da980;
  case AtomicCmpxchgId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_009daf5e;
    }
    goto LAB_009da966;
  case AtomicWaitId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_009daf5e;
    }
    goto LAB_009da0a4;
  case AtomicNotifyId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab27;
  case AtomicFenceId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_009daf5e;
    }
    break;
  case SIMDExtractId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_009daf5e;
    }
    goto LAB_009dabd7;
  case SIMDReplaceId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_009daf5e;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_009dab32;
  case SIMDShuffleId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_009daf5e;
    }
    goto LAB_009daaac;
  case SIMDTernaryId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_009daf5e;
    }
    goto LAB_009da0a4;
  case SIMDShiftId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab27;
  case SIMDLoadId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_009daf5e;
    }
    goto LAB_009da717;
  case SIMDLoadStoreLaneId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_009daf5e;
    }
LAB_009da899:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_009dabe5;
  case MemoryInitId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_009daf5e;
    }
LAB_009da966:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)(pEVar1 + 3));
    goto LAB_009da980;
  case DataDropId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_009daf5e;
    }
    break;
  case MemoryCopyId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_009daf5e;
    }
    goto LAB_009da521;
  case MemoryFillId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_009daf5e;
    }
    goto LAB_009da521;
  case PopId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_009daf5e;
    }
    break;
  case RefNullId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_009daf5e;
    }
    break;
  case RefIsNullId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case RefFuncId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_009daf5e;
    }
    break;
  case RefEqId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_009daf5e;
    }
    goto LAB_009daaac;
  case TableGetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_009daf5e;
    }
    goto LAB_009da7e2;
  case TableSetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_009daf5e;
    }
    goto LAB_009da980;
  case TableSizeId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_009daf5e;
    }
    break;
  case TableGrowId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_009daf5e;
    }
LAB_009da980:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_009dabe5;
  case TryId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_009daf5e;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_009da7e2:
    pEVar1 = pEVar1 + 2;
    goto LAB_009dabe5;
  case ThrowId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_009daf5e;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_009daf5e;
    }
    break;
  case TupleMakeId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_009daf5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case I31NewId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case I31GetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case CallRefId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_009daf5e;
    }
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case RefCastId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case BrOnId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_009daf5e;
    }
LAB_009da717:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_009dabe5;
  case StructNewId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_009daf5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_009daf5e;
    }
    goto LAB_009dabd7;
  case StructSetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab27;
  case ArrayNewId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_009daf5e;
    }
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[1].type);
LAB_009da20d:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x009da216:
    if (lVar5 != 0) {
LAB_009da467:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ).
                     super_Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_009daf5e;
    }
    goto LAB_009da2b5;
  case ArrayNewFixedId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_009daf5e;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_009dabfb;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                  *)self,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_009daf5e;
    }
    goto LAB_009daaac;
  case ArraySetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_009daf5e;
    }
    goto LAB_009da521;
  case ArrayLenId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab06;
  case ArrayCopyId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_009daf5e;
    }
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)(pEVar1 + 3));
    goto LAB_009da046;
  case ArrayFillId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_009daf5e;
    }
LAB_009da046:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[2].type);
    goto LAB_009da521;
  case ArrayInitId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_009daf5e;
    }
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)(pEVar1 + 4));
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[3].type);
LAB_009da2b5:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_009dabe5;
  case RefAsId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_009daf5e;
    }
    goto LAB_009dabd7;
  case StringNewId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_009daf5e;
    }
    local_38 = pEVar1 + 3;
    local_40 = scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ).
                     super_Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ).
                     super_Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ).
                     super_Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_009dabd7;
  case StringConstId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_009daf5e;
    }
    break;
  case StringMeasureId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_009daf5e;
    }
    goto LAB_009dabd7;
  case StringEncodeId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_009daf5e;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,wasm::UnifiedExpressionVisitor<wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ).
                     super_Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_009dab27;
  case StringConcatId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_009daf5e;
    }
    goto LAB_009daaac;
  case StringEqId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_009daf5e;
    }
    goto LAB_009dab27;
  case StringAsId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_009daf5e;
    }
LAB_009dabd7:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_009dabe5;
  case StringWTF8AdvanceId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_009daf5e;
    }
LAB_009da521:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)(pEVar1 + 2));
    goto LAB_009daaac;
  case StringWTF16GetId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_009daf5e;
    }
    goto LAB_009daaac;
  case StringIterNextId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_009daf5e;
    }
LAB_009dab06:
    pEVar1 = pEVar1 + 1;
LAB_009dabe5:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_009daf5e;
    }
LAB_009dab27:
    currp_00 = pEVar1 + 2;
LAB_009dab32:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_009dabe5;
  case StringSliceWTFId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_009daf5e;
    }
LAB_009da0a4:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_009dab32;
  case StringSliceIterId:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                     ::doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_009daf5e;
    }
LAB_009daaac:
    Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
    pushTask((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)self,scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_009dabe5;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }